

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddCircleFilled(ImDrawList *this,ImVec2 *center,float radius,ImU32 col,int num_segments)

{
  int local_24;
  float a_max;
  int num_segments_local;
  ImU32 col_local;
  float radius_local;
  ImVec2 *center_local;
  ImDrawList *this_local;
  
  if (((col & 0xff000000) != 0) && (0.0 < radius)) {
    if (num_segments < 1) {
      local_24 = _CalcCircleAutoSegmentCount(this,radius);
    }
    else {
      local_24 = ImClamp<int>(num_segments,3,0x200);
    }
    if (local_24 == 0xc) {
      PathArcToFast(this,center,radius,0,0xb);
    }
    else {
      PathArcTo(this,center,radius,0.0,(((float)local_24 - 1.0) * 6.2831855) / (float)local_24,
                local_24 + -1);
    }
    PathFillConvex(this,col);
  }
  return;
}

Assistant:

void ImDrawList::AddCircleFilled(const ImVec2& center, float radius, ImU32 col, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0 || radius <= 0.0f)
        return;

    // Obtain segment count
    if (num_segments <= 0)
    {
        // Automatic segment count
        num_segments = _CalcCircleAutoSegmentCount(radius);
    }
    else
    {
        // Explicit segment count (still clamp to avoid drawing insanely tessellated shapes)
        num_segments = ImClamp(num_segments, 3, IM_DRAWLIST_CIRCLE_AUTO_SEGMENT_MAX);
    }

    // Because we are filling a closed shape we remove 1 from the count of segments/points
    const float a_max = (IM_PI * 2.0f) * ((float)num_segments - 1.0f) / (float)num_segments;
    if (num_segments == 12)
        PathArcToFast(center, radius, 0, 12 - 1);
    else
        PathArcTo(center, radius, 0.0f, a_max, num_segments - 1);
    PathFillConvex(col);
}